

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::FunctionReturnVisitor::visit(FunctionReturnVisitor *this,Generator *generator)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  *pmVar4;
  element_type *peVar5;
  element_type *stmt;
  uint64_t __n;
  pointer args;
  StmtException *this_00;
  char (*format_str) [56];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_1d0;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_1c8 [8];
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_1c0;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_1b8 [8];
  string local_1b0;
  string local_190;
  undefined1 local_170 [32];
  uint64_t i;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  function<bool_(kratos::Stmt_*)> local_130;
  undefined1 local_109;
  undefined4 local_108;
  bool has_return;
  undefined1 local_f8 [8];
  shared_ptr<kratos::FunctionStmtBlock> func;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  functions;
  Generator *generator_local;
  FunctionReturnVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  functions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)generator;
  pmVar4 = Generator::functions_abi_cxx11_(generator);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
         *)&__range2,pmVar4);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                    *)&__range2);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                   *)&__range2);
  do {
    bVar2 = std::operator!=(&__end2,(_Self *)&iter);
    if (!bVar2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              *)&__range2);
      return;
    }
    func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>
           ::operator*(&__end2);
    std::shared_ptr<kratos::FunctionStmtBlock>::shared_ptr
              ((shared_ptr<kratos::FunctionStmtBlock> *)local_f8,
               &((reference)
                func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->second);
    peVar5 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_f8);
    uVar3 = (*(peVar5->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xe])();
    if ((uVar3 & 1) == 0) {
LAB_003d77b0:
      local_108 = 3;
    }
    else {
      peVar5 = std::
               __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f8);
      uVar3 = (*(peVar5->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
      if ((uVar3 & 1) != 0) goto LAB_003d77b0;
      stmt = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                        local_f8);
      std::function<bool(kratos::Stmt*)>::
      function<kratos::FunctionReturnVisitor::visit(kratos::Generator*)::_lambda(kratos::Stmt*)_1_,void>
                ((function<bool(kratos::Stmt*)> *)&local_130,
                 (anon_class_1_0_00000001 *)
                 ((long)&stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar2 = check_stmt_condition((Stmt *)stmt,&local_130,true,true);
      std::function<bool_(kratos::Stmt_*)>::~function(&local_130);
      local_109 = bVar2;
      if (!bVar2) {
        std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::vector
                  ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        peVar5 = std::
                 __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_f8);
        __n = StmtBlock::size(&peVar5->super_StmtBlock);
        std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
                  ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i,__n);
        local_170._24_8_ = (pointer)0x0;
        while( true ) {
          uVar1 = local_170._24_8_;
          peVar5 = std::
                   __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_f8);
          args = (pointer)StmtBlock::size(&peVar5->super_StmtBlock);
          if (args <= (ulong)uVar1) break;
          peVar5 = std::
                   __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_f8);
          StmtBlock::get_stmt((StmtBlock *)local_170,(uint64_t)peVar5);
          local_170._16_8_ =
               std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_170);
          std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                    ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&i,
                     (Stmt **)(local_170 + 0x10));
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_170);
          local_170._24_8_ =
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_170._24_8_)->field_0x1;
        }
        this_00 = (StmtException *)__cxa_allocate_exception(0x10);
        peVar5 = std::
                 __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_f8);
        FunctionStmtBlock::function_name_abi_cxx11_(&local_1b0,peVar5);
        local_38 = &local_190;
        local_40 = "{0} does not have return statement in all control flows";
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1b0;
        local_68.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string,char[56],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)"{0} does not have return statement in all control flows",(v7 *)vargs,
                        format_str,&args->first);
        local_50 = &local_68;
        local_78 = fmt::v7::to_string_view<char,_0>(local_40);
        local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_30 = local_50;
        local_20 = local_50;
        local_10 = local_50;
        local_18 = local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_50->string);
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_78.size_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_80.values_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_190,(detail *)local_78.data_,format_str_00,args_00);
        local_1c0._M_current =
             (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin
                                ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        __gnu_cxx::
        __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
        ::__normal_iterator<kratos::Stmt**>(local_1b8,&local_1c0);
        local_1d0._M_current =
             (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end
                                ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        __gnu_cxx::
        __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
        ::__normal_iterator<kratos::Stmt**>(local_1c8,&local_1d0);
        StmtException::StmtException
                  (this_00,&local_190,(const_iterator *)local_1b8,(const_iterator *)local_1c8);
        __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
      }
      local_108 = 0;
    }
    std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::FunctionStmtBlock> *)local_f8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void visit(Generator* generator) override {
        // check all the function definitions
        auto functions = generator->functions();
        for (auto const& iter : functions) {
            auto func = iter.second;
            // check if the function has a return
            if (!func->has_return_value() || func->is_builtin()) continue;
            // build statement graph
            bool has_return = check_stmt_condition(
                func.get(),
                [](Stmt* stmt) -> bool { return stmt->type() == StatementType::Return; }, true);
            if (!has_return) {
                std::vector<Stmt*> stmts;
                stmts.reserve(func->size());
                for (uint64_t i = 0; i < func->size(); i++) {
                    stmts.emplace_back(func->get_stmt(i).get());
                }
                throw StmtException(
                    ::format("{0} does not have return statement in all control flows",
                             func->function_name()),
                    stmts.begin(), stmts.end());
            }
        }
    }